

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O1

MainFunc __thiscall capnp::compiler::CompilerMain::getMain(CompilerMain *this)

{
  StringPtr extendedDescription;
  StringPtr extendedDescription_00;
  Iface *pIVar1;
  Iface *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  MainBuilder *pMVar4;
  long extraout_RDX;
  long extraout_RDX_00;
  Iface *extraout_RDX_01;
  CompilerMain *in_RSI;
  OptionName *this_00;
  MainFunc MVar5;
  StringPtr version;
  StringPtr version_00;
  StringPtr briefDescription;
  StringPtr helpText;
  StringPtr helpText_00;
  StringPtr helpText_01;
  StringPtr helpText_02;
  StringPtr helpText_03;
  StringPtr helpText_04;
  StringPtr briefDescription_00;
  StringPtr helpText_05;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  initializer_list<kj::MainBuilder::OptionName> names;
  MainBuilder builder_1;
  MainBuilder builder;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_d8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_c8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_b8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_a8;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_98;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> local_88;
  Function<kj::MainBuilder::Validity_()> local_78;
  OptionName local_68;
  OptionName local_58;
  undefined1 local_48;
  char *local_40;
  char *local_38;
  undefined8 uStack_30;
  char *local_28;
  undefined8 uStack_20;
  
  iVar3 = (**in_RSI->context->_vptr_ProcessContext)();
  if ((extraout_RDX - 1U < 6) ||
     (*(short *)(CONCAT44(extraout_var,iVar3) + -3 + extraout_RDX) != 0x6370 ||
      *(int *)(CONCAT44(extraout_var,iVar3) + -7 + extraout_RDX) != 0x6e706163)) {
    iVar3 = (**in_RSI->context->_vptr_ProcessContext)();
    if ((extraout_RDX_00 - 1U < 10) ||
       (*(short *)(CONCAT44(extraout_var_00,iVar3) + -3 + extraout_RDX_00) != 0x6578 ||
        *(long *)(CONCAT44(extraout_var_00,iVar3) + -0xb + extraout_RDX_00) != 0x652e63706e706163))
    {
      local_38 = "";
      uStack_30 = 1;
      extendedDescription.content.size_ = 1;
      extendedDescription.content.ptr = "";
      version.content.size_ = 0x1c;
      version.content.ptr = "Cap\'n Proto version 2.0-dev";
      briefDescription.content.size_ = 0x3d;
      briefDescription.content.ptr = "Command-line tool for Cap\'n Proto development and debugging."
      ;
      kj::MainBuilder::MainBuilder
                ((MainBuilder *)&local_58,in_RSI->context,version,briefDescription,
                 extendedDescription);
      local_88.impl.ptr = (Iface *)operator_new(0x18);
      (local_88.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00289420;
      local_88.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_88.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#3},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#4}>>>
            ::instance;
      helpText.content.size_ = 0x28;
      helpText.content.ptr = "Generate source code from schema files.";
      name.content.size_ = 8;
      name.content.ptr = "compile";
      pMVar4 = kj::MainBuilder::addSubCommand((MainBuilder *)&local_58,name,&local_88,helpText);
      local_98.impl.ptr = (Iface *)operator_new(0x18);
      (local_98.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00289498;
      local_98.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_98.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#5},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#6}>>>
            ::instance;
      helpText_00.content.size_ = 0x1a;
      helpText_00.content.ptr = "Generate a new unique ID.";
      name_00.content.size_ = 3;
      name_00.content.ptr = "id";
      pMVar4 = kj::MainBuilder::addSubCommand(pMVar4,name_00,&local_98,helpText_00);
      local_a8.impl.ptr = (Iface *)operator_new(0x18);
      (local_a8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00289568;
      local_a8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_a8.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#7},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#8}>>>
            ::instance;
      helpText_01.content.size_ = 0x32;
      helpText_01.content.ptr = "Convert messages between binary, text, JSON, etc.";
      name_01.content.size_ = 8;
      name_01.content.ptr = "convert";
      pMVar4 = kj::MainBuilder::addSubCommand(pMVar4,name_01,&local_a8,helpText_01);
      local_b8.impl.ptr = (Iface *)operator_new(0x18);
      (local_b8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00289a28;
      local_b8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_b8.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#9},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#10}>>>
            ::instance;
      helpText_02.content.size_ = 0x1b;
      helpText_02.content.ptr = "DEPRECATED (use `convert`)";
      name_02.content.size_ = 7;
      name_02.content.ptr = "decode";
      pMVar4 = kj::MainBuilder::addSubCommand(pMVar4,name_02,&local_b8,helpText_02);
      local_c8.impl.ptr = (Iface *)operator_new(0x18);
      (local_c8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00289d68;
      local_c8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_c8.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#11},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#12}>>>
            ::instance;
      helpText_03.content.size_ = 0x1b;
      helpText_03.content.ptr = "DEPRECATED (use `convert`)";
      name_03.content.size_ = 7;
      name_03.content.ptr = "encode";
      pMVar4 = kj::MainBuilder::addSubCommand(pMVar4,name_03,&local_c8,helpText_03);
      local_d8.impl.ptr = (Iface *)operator_new(0x18);
      (local_d8.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___0028a040;
      local_d8.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
      local_d8.impl.disposer =
           (Disposer *)
           &kj::_::
            HeapDisposer<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#13},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#14}>>>
            ::instance;
      helpText_04.content.size_ = 0x25;
      helpText_04.content.ptr = "Evaluate a const from a schema file.";
      name_04.content.size_ = 5;
      name_04.content.ptr = "eval";
      kj::MainBuilder::addSubCommand(pMVar4,name_04,&local_d8,helpText_04);
      pIVar1 = local_d8.impl.ptr;
      if (local_d8.impl.ptr != (Iface *)0x0) {
        local_d8.impl.ptr = (Iface *)0x0;
        (**(local_d8.impl.disposer)->_vptr_Disposer)
                  (local_d8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      pIVar1 = local_c8.impl.ptr;
      if (local_c8.impl.ptr != (Iface *)0x0) {
        local_c8.impl.ptr = (Iface *)0x0;
        (**(local_c8.impl.disposer)->_vptr_Disposer)
                  (local_c8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      pIVar1 = local_b8.impl.ptr;
      if (local_b8.impl.ptr != (Iface *)0x0) {
        local_b8.impl.ptr = (Iface *)0x0;
        (**(local_b8.impl.disposer)->_vptr_Disposer)
                  (local_b8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      pIVar1 = local_a8.impl.ptr;
      if (local_a8.impl.ptr != (Iface *)0x0) {
        local_a8.impl.ptr = (Iface *)0x0;
        (**(local_a8.impl.disposer)->_vptr_Disposer)
                  (local_a8.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      pIVar1 = local_98.impl.ptr;
      if (local_98.impl.ptr != (Iface *)0x0) {
        local_98.impl.ptr = (Iface *)0x0;
        (**(local_98.impl.disposer)->_vptr_Disposer)
                  (local_98.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      pIVar1 = local_88.impl.ptr;
      if (local_88.impl.ptr != (Iface *)0x0) {
        local_88.impl.ptr = (Iface *)0x0;
        (**(local_88.impl.disposer)->_vptr_Disposer)
                  (local_88.impl.disposer,pIVar1->_vptr_Iface[-2] + (long)&pIVar1->_vptr_Iface);
      }
      addGlobalOptions(in_RSI,(MainBuilder *)&local_58);
      kj::MainBuilder::build((MainBuilder *)this);
      this_00 = &local_58;
      goto LAB_0011660c;
    }
  }
  local_28 = "";
  uStack_20 = 1;
  extendedDescription_00.content.size_ = 1;
  extendedDescription_00.content.ptr = "";
  version_00.content.size_ = 0x1c;
  version_00.content.ptr = "Cap\'n Proto version 2.0-dev";
  briefDescription_00.content.size_ = 100;
  briefDescription_00.content.ptr =
       "Compiles Cap\'n Proto schema files and generates corresponding source code in one or more languages."
  ;
  kj::MainBuilder::MainBuilder
            ((MainBuilder *)&local_68,in_RSI->context,version_00,briefDescription_00,
             extendedDescription_00);
  addGlobalOptions(in_RSI,(MainBuilder *)&local_68);
  addCompileOptions(in_RSI,(MainBuilder *)&local_68);
  local_58.isLong = false;
  local_58.field_1.shortName = 'i';
  local_48 = 1;
  local_40 = "generate-id";
  local_78.impl.ptr = (Iface *)operator_new(0x18);
  (local_78.impl.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___002893b8;
  local_78.impl.ptr[1]._vptr_Iface = (_func_int **)in_RSI;
  local_78.impl.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<kj::MainBuilder::Validity()>::Impl<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#1},capnp::compiler::CompilerMain::getMain()::{lambda(auto:1&,(auto:2&&)...)#2}>>>
        ::instance;
  helpText_05.content.size_ = 0x41;
  helpText_05.content.ptr = "Generate a new 64-bit unique ID for use in a Cap\'n Proto schema.";
  names._M_len = 2;
  names._M_array = &local_58;
  kj::MainBuilder::addOption((MainBuilder *)&local_68,names,&local_78,helpText_05);
  pIVar2 = local_78.impl.ptr;
  if (local_78.impl.ptr != (Iface *)0x0) {
    local_78.impl.ptr = (Iface *)0x0;
    (**(local_78.impl.disposer)->_vptr_Disposer)
              (local_78.impl.disposer,pIVar2->_vptr_Iface[-2] + (long)&pIVar2->_vptr_Iface);
  }
  kj::MainBuilder::build((MainBuilder *)this);
  this_00 = &local_68;
LAB_0011660c:
  kj::MainBuilder::~MainBuilder((MainBuilder *)this_00);
  MVar5.impl.ptr = extraout_RDX_01;
  MVar5.impl.disposer = (Disposer *)this;
  return (MainFunc)MVar5.impl;
}

Assistant:

kj::MainFunc getMain() {
    if (context.getProgramName().endsWith("capnpc") || context.getProgramName().endsWith("capnpc.exe")) {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Compiles Cap'n Proto schema files and generates corresponding source code in one or "
            "more languages.");
      addGlobalOptions(builder);
      addCompileOptions(builder);
      builder.addOption({'i', "generate-id"}, KJ_BIND_METHOD(*this, generateId),
                        "Generate a new 64-bit unique ID for use in a Cap'n Proto schema.");
      return builder.build();
    } else {
      kj::MainBuilder builder(context, VERSION_STRING,
            "Command-line tool for Cap'n Proto development and debugging.");
      builder.addSubCommand("compile", KJ_BIND_METHOD(*this, getCompileMain),
                            "Generate source code from schema files.")
             .addSubCommand("id", KJ_BIND_METHOD(*this, getGenIdMain),
                            "Generate a new unique ID.")
             .addSubCommand("convert", KJ_BIND_METHOD(*this, getConvertMain),
                            "Convert messages between binary, text, JSON, etc.")
             .addSubCommand("decode", KJ_BIND_METHOD(*this, getDecodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("encode", KJ_BIND_METHOD(*this, getEncodeMain),
                            "DEPRECATED (use `convert`)")
             .addSubCommand("eval", KJ_BIND_METHOD(*this, getEvalMain),
                            "Evaluate a const from a schema file.");
      addGlobalOptions(builder);
      return builder.build();
    }
  }